

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::JsBuiltInEngineInterfaceExtensionObject::
    EntryJsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  double dVar3;
  bool bVar4;
  undefined4 *puVar5;
  JavascriptArray *this;
  ScriptContext *in_R9;
  uint uVar6;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dd;
  BigIndex index;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  uint64 in_stack_00000030;
  undefined1 local_58 [8];
  BigIndex bigIndex;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar6 = callInfo._0_4_;
  if (in_stack_00000010 != uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,500,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d3baa8;
    *puVar5 = 0;
  }
  if ((uVar6 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,500,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00d3baa8;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar6 & 0xffffff) != 4) {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,500,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar4) goto LAB_00d3baa8;
      *puVar5 = 0;
      if ((uVar6 & 0xffffff) == 4) goto LAB_00d3b927;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1f5,"(args.Info.Count == 4)","args.Info.Count == 4");
    if (!bVar4) goto LAB_00d3baa8;
    *puVar5 = 0;
  }
LAB_00d3b927:
  this = (JavascriptArray *)VarTo<Js::RecyclableObject>(in_stack_00000020);
  if (((ulong)in_stack_00000028 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)in_stack_00000028 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00d3baa8;
    *puVar5 = 0;
  }
  if (((ulong)in_stack_00000028 & 0xffff000000000000) == 0x1000000000000) {
    uVar7 = 0;
    uVar8 = 0;
    dVar3 = (double)(int)in_stack_00000028;
  }
  else {
    dVar3 = JavascriptConversion::ToInteger_Full(in_stack_00000028,pSVar1);
    uVar7 = extraout_XMM0_Dc;
    uVar8 = extraout_XMM0_Dd;
  }
  if (dVar3 < 0.0) {
    unique0x10000110 = uVar7;
    bigIndex.bigIndex = (uint64)dVar3;
    unique0x10000114 = uVar8;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1f9,"(index >= 0)","index >= 0");
    if (!bVar4) {
LAB_00d3baa8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    dVar3 = (double)bigIndex.bigIndex;
  }
  JavascriptArray::BigIndex::BigIndex
            ((BigIndex *)local_58,
             (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3);
  index.bigIndex = in_stack_00000030;
  index.index = bigIndex.index;
  index._4_4_ = bigIndex._4_4_;
  JavascriptArray::CreateDataPropertyOrThrow
            (this,(RecyclableObject *)(ulong)(uint)local_58._0_4_,index,pSVar1,in_R9);
  return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         booleanTrue.ptr;
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow(RecyclableObject *function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        AssertOrFailFast(args.Info.Count == 4);

        RecyclableObject * obj = VarTo<RecyclableObject>(args.Values[1]);
        double index = JavascriptConversion::ToInteger(args.Values[2], scriptContext);
        AssertOrFailFast(index >= 0);
        JavascriptArray::BigIndex bigIndex(static_cast<uint64>(index));
        Var item = args.Values[3];

        JavascriptArray::CreateDataPropertyOrThrow(obj, bigIndex, item, scriptContext);
        return scriptContext->GetLibrary()->GetTrue();
    }